

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeSignedInteger
          (ParserImpl *this,int64 *value,uint64 max_value)

{
  bool bVar1;
  uint64 local_70;
  uint64 unsigned_value;
  allocator local_51;
  string local_50;
  byte local_29;
  uint64 uStack_28;
  bool negative;
  uint64 max_value_local;
  int64 *value_local;
  ParserImpl *this_local;
  
  local_29 = 0;
  uStack_28 = max_value;
  max_value_local = (uint64)value;
  value_local = (int64 *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"-",&local_51);
  bVar1 = TryConsume(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (bVar1) {
    local_29 = 1;
    uStack_28 = uStack_28 + 1;
  }
  bVar1 = ConsumeUnsignedInteger(this,&local_70,uStack_28);
  if (bVar1) {
    if ((local_29 & 1) == 0) {
      *(uint64 *)max_value_local = local_70;
    }
    else if (local_70 == 0x8000000000000000) {
      *(undefined8 *)max_value_local = 0x8000000000000000;
    }
    else {
      *(uint64 *)max_value_local = -local_70;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConsumeSignedInteger(int64* value, uint64 max_value) {
    bool negative = false;

    if (TryConsume("-")) {
      negative = true;
      // Two's complement always allows one more negative integer than
      // positive.
      ++max_value;
    }

    uint64 unsigned_value;

    DO(ConsumeUnsignedInteger(&unsigned_value, max_value));

    if (negative) {
      if ((static_cast<uint64>(kint64max) + 1) == unsigned_value) {
        *value = kint64min;
      } else {
        *value = -static_cast<int64>(unsigned_value);
      }
    } else {
      *value = static_cast<int64>(unsigned_value);
    }

    return true;
  }